

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

optional<tinyusdz::Token> * __thiscall
tinyusdz::crate::CrateReader::GetToken
          (optional<tinyusdz::Token> *__return_storage_ptr__,CrateReader *this,Index token_index)

{
  pointer pTVar1;
  
  pTVar1 = (this->_tokens).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)token_index.value <
      (ulong)((long)(this->_tokens).
                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pTVar1 >> 5)) {
    nonstd::optional_lite::optional<tinyusdz::Token>::optional<const_tinyusdz::Token_&,_0>
              (__return_storage_ptr__,pTVar1 + token_index.value);
  }
  else {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

const nonstd::optional<value::token> CrateReader::GetToken(
    crate::Index token_index) const {
  if (token_index.value < _tokens.size()) {
    return _tokens[token_index.value];
  } else {
    return nonstd::nullopt;
  }
}